

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_parry(CHAR_DATA *ch,CHAR_DATA *victim,int dt)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  OBJ_DATA *pOVar4;
  const_reference pvVar5;
  CClass *pCVar6;
  float *pfVar7;
  int in_EDX;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var8;
  int diff;
  int roll;
  OBJ_DATA *victimwield;
  char *attack;
  char buf2 [4608];
  char buf1 [4608];
  OBJ_DATA *wield;
  float chance;
  int cd_sk;
  CHAR_DATA *in_stack_ffffffffffffdb58;
  ulong uVar9;
  CHAR_DATA *in_stack_ffffffffffffdb60;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffdb68;
  CHAR_DATA *ch_00;
  char_data *in_stack_ffffffffffffdb70;
  char *ch_01;
  char *local_2480;
  float local_2454;
  int local_2450;
  int local_244c;
  OBJ_DATA *local_2448;
  char *local_2440;
  char local_2438 [108];
  int in_stack_ffffffffffffdc34;
  undefined1 in_stack_ffffffffffffdc3b;
  int in_stack_ffffffffffffdc3c;
  CHAR_DATA *in_stack_ffffffffffffdc40;
  int in_stack_ffffffffffffdc5c;
  CHAR_DATA *in_stack_ffffffffffffdc60;
  char local_1238 [4616];
  OBJ_DATA *local_30;
  float local_24;
  int local_20;
  int local_1c;
  CHAR_DATA *local_18;
  CHAR_DATA *local_10;
  bool local_1;
  
  local_20 = 0;
  local_24 = 0.0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bVar1 = is_awake(in_RSI);
  if (!bVar1) {
    return false;
  }
  iVar3 = get_skill(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc5c);
  local_24 = (float)(iVar3 / 2);
  pOVar4 = get_eq_char(local_18,0x10);
  if (pOVar4 == (OBJ_DATA *)0x0) {
    bVar1 = is_npc(in_stack_ffffffffffffdb58);
    if (bVar1) {
      local_24 = local_24 / 2.0;
    }
    else {
      bVar1 = is_affected(local_18,(int)gsn_hardenfist);
      if (!bVar1) {
        return false;
      }
    }
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffdb68,(int)((ulong)in_stack_ffffffffffffdb60 >> 0x20));
  if (bVar1) {
    local_24 = local_24 + 20.0;
  }
  bVar1 = is_affected_by(in_stack_ffffffffffffdb68,(int)((ulong)in_stack_ffffffffffffdb60 >> 0x20));
  if (bVar1) {
    local_24 = local_24 - 15.0;
  }
  local_20 = get_skill(in_stack_ffffffffffffdc60,in_stack_ffffffffffffdc5c);
  if (1 < local_20) {
    iVar3 = number_percent();
    if ((double)local_20 * 0.85 <= (double)iVar3) {
      check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                    (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
    }
    else {
      local_24 = local_24 + 10.0;
      check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                    (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
    }
  }
  local_24 = (float)(int)local_10->defense_mod + local_24;
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if (!bVar1) {
    iVar3 = (int)local_10->pcdata->energy_state;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (1 < iVar3) {
      _Var8 = std::pow<int,int>(0,0x5dd433);
      local_24 = (float)((double)local_24 - _Var8);
    }
  }
  iVar3 = (int)local_10->size - (int)local_18->size;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  local_24 = local_24 - (float)(iVar3 * 5);
  if (local_1c == gsn_dual_wield) {
    local_30 = get_eq_char(local_10,0x12);
  }
  else {
    local_30 = get_eq_char(local_10,0x10);
  }
  if (local_30 != (OBJ_DATA *)0x0) {
    switch(local_30->value[0]) {
    case 0:
      break;
    case 1:
      local_24 = local_24 + 5.0;
      break;
    case 2:
      local_24 = local_24 - 5.0;
      break;
    case 3:
      local_24 = local_24 + 0.0;
      break;
    case 4:
      local_24 = local_24 - 10.0;
      break;
    case 5:
      local_24 = local_24 - 10.0;
      break;
    case 6:
      local_24 = local_24 + 10.0;
      break;
    case 7:
      local_24 = local_24 + 10.0;
      break;
    case 8:
      local_24 = local_24 - 5.0;
      break;
    case 9:
      local_24 = local_24 + 0.0;
      break;
    default:
      local_24 = local_24 + 40.0;
    }
  }
  local_2448 = get_eq_char(local_18,0x10);
  if (local_2448 != (OBJ_DATA *)0x0) {
    switch(local_2448->value[0]) {
    case 0:
      break;
    case 1:
      local_24 = local_24 + 10.0;
      break;
    case 2:
      local_24 = local_24 - 20.0;
      break;
    case 3:
      local_24 = local_24 + 15.0;
      break;
    case 4:
      local_24 = local_24 - 10.0;
      break;
    case 5:
      local_24 = local_24 - 10.0;
      break;
    case 6:
      local_24 = local_24 - 10.0;
      break;
    case 7:
      local_24 = local_24 - 20.0;
      break;
    case 8:
      local_24 = local_24 + 15.0;
      break;
    case 9:
      local_24 = local_24 + 15.0;
      break;
    default:
      local_24 = local_24 - 20.0;
    }
  }
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if (((!bVar1) && (iVar3 = check_posture(local_10), iVar3 == -1)) &&
     (bVar1 = style_check((int)in_stack_ffffffffffffdb60,
                          (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20)), bVar1)) {
    local_24 = local_24 + 20.0;
  }
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if (!bVar1) {
    iVar3 = check_posture(local_18);
    if ((iVar3 == -1) &&
       (bVar1 = style_check((int)in_stack_ffffffffffffdb60,
                            (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20)), bVar1)) {
      local_24 = local_24 + 20.0;
    }
    iVar3 = check_posture(local_18);
    if ((iVar3 == 1) &&
       (bVar1 = style_check((int)in_stack_ffffffffffffdb60,
                            (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20)), bVar1)) {
      local_24 = local_24 - 20.0;
    }
  }
  bVar1 = is_evil(in_stack_ffffffffffffdb58);
  if (((bVar1) && (local_18->level < local_10->level)) &&
     (bVar1 = is_affected(local_10,(int)gsn_awe), bVar1)) {
    local_24 = local_24 - 10.0;
  }
  local_24 = (((float)(int)local_10->balance + (local_24 - (float)(int)local_18->balance)) -
             (float)(int)local_10->batter) - (float)local_10->analyze;
  if (local_18->analyzePC == local_10) {
    local_24 = (float)local_18->analyze + local_24;
  }
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if ((!bVar1) &&
     (uVar9 = local_18->act[0], _Var8 = std::pow<int,int>(0,0x5dda95), (uVar9 & (long)_Var8) != 0))
  {
    local_24 = local_24 / 2.0;
  }
  bVar1 = check_entwine(local_18,1);
  if (bVar1) {
    local_24 = local_24 / 2.0;
  }
  iVar3 = get_attack_number(in_stack_ffffffffffffdb68,
                            (int)((ulong)in_stack_ffffffffffffdb60 >> 0x20));
  pvVar5 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                     (&attack_table,(long)iVar3);
  local_24 = local_24 + (float)pvVar5->modifier;
  sVar2 = get_hitroll(in_stack_ffffffffffffdb58);
  local_24 = (1.0 - (float)(int)sVar2 / 250.0) * local_24;
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if (!bVar1) {
    pCVar6 = char_data::Class(in_stack_ffffffffffffdb70);
    iVar3 = CClass::GetIndex(pCVar6);
    if (iVar3 == 10) {
      local_24 = local_24 * 0.7;
      goto LAB_005ddc1c;
    }
  }
  bVar1 = is_npc(in_stack_ffffffffffffdb58);
  if (!bVar1) {
    pCVar6 = char_data::Class(in_stack_ffffffffffffdb70);
    iVar3 = CClass::GetIndex(pCVar6);
    if (iVar3 == 0xb) {
      local_24 = local_24 * 0.85;
    }
  }
LAB_005ddc1c:
  local_2454 = 95.0;
  pfVar7 = std::min<float>(&local_24,&local_2454);
  local_24 = *pfVar7;
  local_244c = number_percent();
  if ((float)local_244c < local_24) {
    local_2450 = (int)(local_24 - (float)local_244c);
    local_2440 = get_dam_message(in_stack_ffffffffffffdb60,
                                 (int)((ulong)in_stack_ffffffffffffdb58 >> 0x20));
    if (local_2450 < 0xf) {
      local_2480 = "manage to ";
    }
    else {
      local_2480 = "";
      if (0x32 < local_2450) {
        local_2480 = "confidently ";
      }
    }
    sprintf(local_1238,"You %sparry $n\'s %s.",local_2480,local_2440);
    if (local_2450 < 0xf) {
      ch_01 = "manages to parry";
    }
    else {
      ch_01 = "confidently parries";
      if (local_2450 < 0x32) {
        ch_01 = "parries";
      }
    }
    sprintf(local_2438,"$N %s your %s.",ch_01,local_2440);
    ch_00 = (CHAR_DATA *)local_18->wiznet[0];
    _Var8 = std::pow<int,int>(0,0x5ddd7d);
    if (((ulong)ch_00 & (long)_Var8) != 0) {
      sprintf(local_1238,"You parry $n\'s %s. (%d%%)",local_2440,(ulong)(uint)(int)local_24);
    }
    arg1 = (void *)local_10->wiznet[0];
    _Var8 = std::pow<int,int>(0,0x5dddd7);
    if (((ulong)arg1 & (long)_Var8) != 0) {
      sprintf(local_2438,"$N parries your %s. (%d%%)",local_2440,(ulong)(uint)(int)local_24);
    }
    act(ch_01,ch_00,arg1,in_stack_ffffffffffffdb58,0);
    act(ch_01,ch_00,arg1,in_stack_ffffffffffffdb58,0);
    iVar3 = (int)arg1;
    check_improve(in_stack_ffffffffffffdc40,in_stack_ffffffffffffdc3c,
                  (bool)in_stack_ffffffffffffdc3b,in_stack_ffffffffffffdc34);
    bVar1 = is_npc(in_stack_ffffffffffffdb58);
    if (bVar1) {
      uVar9 = local_10->progtypes[0];
      _Var8 = std::pow<int,int>(0,0x5ddee4);
      if (((uVar9 & (long)_Var8) != 0) &&
         (bVar1 = str_cmp(local_10->pIndexData->mprogs->fight_name,"fight_prog_barbarian"), !bVar1))
      {
        check_batter((CHAR_DATA *)ch_01);
      }
    }
    else {
      bVar1 = style_check(iVar3,(int)((ulong)in_stack_ffffffffffffdb58 >> 0x20));
      if (bVar1) {
        check_batter((CHAR_DATA *)ch_01);
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_parry(CHAR_DATA *ch, CHAR_DATA *victim, int dt)
{
	int cd_sk = 0;
	float chance = 0;
	OBJ_DATA *wield;
	char buf1[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];
	char *attack;
	OBJ_DATA *victimwield;
	int roll, diff;

	if (!is_awake(victim))
		return false;

	chance = get_skill(victim, gsn_parry) / 2;

	if (get_eq_char(victim, WEAR_WIELD) == nullptr)
	{
		if (is_npc(victim))
		{
			chance /= 2;
		}
		else if (!is_affected(victim, gsn_hardenfist))
			return false;
	}

	if (is_affected_by(victim, AFF_HASTE))
		chance += 20;

	if (is_affected_by(ch, AFF_HASTE))
		chance -= 15;

	cd_sk = get_skill(victim, gsn_champions_defense);

	if (cd_sk > 1)
	{
		if (number_percent() < (cd_sk * .85))
		{
			chance += 10;
			check_improve(victim, gsn_champions_defense, true, 1);
		}
		else
		{
			check_improve(victim, gsn_champions_defense, false, 1);
		}
	}

	chance += ch->defense_mod;

	if (!is_npc(ch) && abs(ch->pcdata->energy_state) > 1)
		chance -= pow(3, abs(ch->pcdata->energy_state));

	chance -= 5 * abs((ch->size - victim->size));

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);
	else
		wield = get_eq_char(ch, WEAR_WIELD);

	if (wield != nullptr)
	{
		switch (wield->value[0])
		{
			case WEAPON_SWORD:
				chance += 5;
				break;
			case WEAPON_DAGGER:
				chance -= 5;
				break;
			case WEAPON_SPEAR:
				chance += 0;
				break;
			case WEAPON_STAFF:
				chance += 0;
				break;
			case WEAPON_MACE:
				chance -= 10;
				break;
			case WEAPON_AXE:
				chance -= 10;
				break;
			case WEAPON_FLAIL:
				chance += 10;
				break;
			case WEAPON_WHIP:
				chance += 10;
				break;
			case WEAPON_POLEARM:
				chance -= 5;
				break;
			case WEAPON_EXOTIC:
				break;
			default:
				chance += 40;
				break;
		}
	}

	victimwield = get_eq_char(victim, WEAR_WIELD);

	if (victimwield != nullptr)
	{
		switch (victimwield->value[0])
		{
			case WEAPON_SWORD:
				chance += 10;
				break;
			case WEAPON_DAGGER:
				chance -= 20;
				break;
			case WEAPON_SPEAR:
				chance += 15;
				break;
			case WEAPON_STAFF:
				chance += 15;
				break;
			case WEAPON_MACE:
				chance -= 10;
				break;
			case WEAPON_AXE:
				chance -= 10;
				break;
			case WEAPON_FLAIL:
				chance -= 10;
				break;
			case WEAPON_WHIP:
				chance -= 20;
				break;
			case WEAPON_POLEARM:
				chance += 15;
				break;
			case WEAPON_EXOTIC:
				break;
			default:
				chance -= 20;
				break;
		}
	}

	/* posture */
	if (!is_npc(ch))
	{
		if (check_posture(ch) == POSTURE_DEFENSE && style_check(gsn_posture, ch->pcdata->style))
			chance += 20;
	}

	if (!is_npc(victim))
	{
		if (check_posture(victim) == POSTURE_DEFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance += 20;
		if (check_posture(victim) == POSTURE_OFFENSE && style_check(gsn_posture, victim->pcdata->style))
			chance -= 20;
	}

	if (is_evil(victim) && (ch->level > victim->level) && is_affected(ch, gsn_awe))
		chance -= 10;

	chance -= victim->balance;
	chance += ch->balance;
	chance -= ch->batter;
	chance -= ch->analyze;

	if (victim->analyzePC == ch)
		chance += victim->analyze;

	if (!is_npc(victim) && IS_SET(victim->act, PLR_MORON))
		chance /= 2;

	if (check_entwine(victim, 1))
		chance /= 2;

	chance += attack_table[get_attack_number(ch, dt)].modifier;
	chance *= (1 - ((float)get_hitroll(ch) / (float)250));

	if (!is_npc(victim) && victim->Class()->GetIndex() == CLASS_NECROMANCER)
		chance *= .7;
	else if (!is_npc(victim) && victim->Class()->GetIndex() == CLASS_SORCERER)
		chance *= .85;

	chance = std::min(chance, (float)95);

	roll = number_percent();

	if (roll >= chance)
		return false;

	diff = (int)(chance - (float)roll);

	attack = get_dam_message(ch, dt);
	sprintf(buf1, "You %sparry $n's %s.", (diff < 15) ? "manage to " : (diff > 50) ? "confidently " : "", attack);
	sprintf(buf2, "$N %s your %s.", (diff < 15) ? "manages to parry" : (diff < 50) ? "parries" : "confidently parries", attack);

	if (IS_SET(victim->wiznet, WIZ_PERCENT))
		sprintf(buf1, "You parry $n's %s. (%d%%)", attack, (int)chance);

	if (IS_SET(ch->wiznet, WIZ_PERCENT))
		sprintf(buf2, "$N parries your %s. (%d%%)", attack, (int)chance);

	act(buf1, ch, 0, victim, TO_VICT);
	act(buf2, ch, 0, victim, TO_CHAR);
	check_improve(victim, gsn_parry, true, 2);

	/* Barbarian batter check */

	if (!is_npc(ch))
	{
		if (style_check(gsn_batter, ch->pcdata->style))
			check_batter(ch);
	}
	else if (IS_SET(ch->progtypes, MPROG_FIGHT) && !str_cmp(ch->pIndexData->mprogs->fight_name, "fight_prog_barbarian"))
	{
		check_batter(ch);
	}

	return true;
}